

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O2

node_t unop(int id,node_t right)

{
  _node_t *to;
  
  to = create_node();
  if (id == 0x2b) {
    id = 0x8d;
  }
  else if (id == 0x2d) {
    id = 0x8c;
  }
  to->id = id;
  to->type = UNOP;
  add_child(to,(_node_t *)right);
  return to;
}

Assistant:

node_t unop(int id, node_t right)
{
    _node_t* new = create_node();
    if (id == '+')
        new->id = POSITIVE;
    else if (id == '-')
        new->id = NEGATIVE;
    else
        new->id = id;
    new->type = UNOP;
    add_child(new, (_node_t*)right);
    return (node_t)new;
}